

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O1

Status __thiscall leveldb::DBImpl::NewDB(DBImpl *this)

{
  WritableFile *pWVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  long in_RSI;
  long in_FS_OFFSET;
  WritableFile *file;
  string record;
  Writer log;
  string manifest;
  VersionEdit new_db;
  WritableFile *local_158;
  DB local_150;
  size_type sStack_148;
  undefined1 local_140 [8];
  WritableFile *local_138;
  string local_130;
  Writer local_110;
  string local_f0;
  VersionEdit local_d0;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  VersionEdit::VersionEdit(&local_d0);
  local_f0._M_dataplus._M_p = (pointer)(**(code **)(**(long **)(in_RSI + 0x18) + 0x18))();
  local_f0._M_string_length = strlen(local_f0._M_dataplus._M_p);
  VersionEdit::SetComparatorName(&local_d0,(Slice *)&local_f0);
  local_d0.has_log_number_ = true;
  local_d0.log_number_ = 0;
  local_d0.has_next_file_number_ = true;
  local_d0.has_last_sequence_ = true;
  local_d0.next_file_number_ = 2;
  local_d0.last_sequence_ = 0;
  DescriptorFileName(&local_f0,(string *)(in_RSI + 0x98),1);
  (**(code **)(**(long **)(in_RSI + 8) + 0x20))(this,*(long **)(in_RSI + 8),&local_f0,&local_138);
  if ((this->super_DB)._vptr_DB == (_func_int **)0x0) {
    leveldb::log::Writer::Writer(&local_110,local_138);
    local_130._M_string_length = 0;
    local_130.field_2._M_local_buf[0] = '\0';
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    VersionEdit::EncodeTo(&local_d0,&local_130);
    local_150._vptr_DB = (_func_int **)local_130._M_dataplus._M_p;
    sStack_148 = local_130._M_string_length;
    leveldb::log::Writer::AddRecord((Writer *)local_140,(Slice *)&local_110);
    pWVar1 = (WritableFile *)(this->super_DB)._vptr_DB;
    (this->super_DB)._vptr_DB = (_func_int **)local_140;
    local_140 = (undefined1  [8])pWVar1;
    if (pWVar1 != (WritableFile *)0x0) {
      operator_delete__(pWVar1);
    }
    if ((this->super_DB)._vptr_DB == (_func_int **)0x0) {
      (*local_138->_vptr_WritableFile[3])(&local_150);
      paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(this->super_DB)._vptr_DB;
      (this->super_DB)._vptr_DB = local_150._vptr_DB;
      local_150._vptr_DB = (_func_int **)paVar2;
      if (paVar2 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
        operator_delete__(paVar2);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,
                      CONCAT71(local_130.field_2._M_allocated_capacity._1_7_,
                               local_130.field_2._M_local_buf[0]) + 1);
    }
    leveldb::log::Writer::~Writer(&local_110);
    if (local_138 != (WritableFile *)0x0) {
      (*local_138->_vptr_WritableFile[1])();
    }
    if ((this->super_DB)._vptr_DB == (_func_int **)0x0) {
      SetCurrentFile((leveldb *)&local_110,*(Env **)(in_RSI + 8),(string *)(in_RSI + 0x98),1);
      local_158 = (WritableFile *)(this->super_DB)._vptr_DB;
      (this->super_DB)._vptr_DB = (_func_int **)local_110.dest_;
      local_110.dest_ = local_158;
    }
    else {
      (**(code **)(**(long **)(in_RSI + 8) + 0x40))(&local_158,*(long **)(in_RSI + 8),&local_f0);
    }
    if (local_158 != (WritableFile *)0x0) {
      operator_delete__(local_158);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  VersionEdit::~VersionEdit(&local_d0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (Status)(char *)this;
  }
  __stack_chk_fail();
}

Assistant:

Status DBImpl::NewDB() {
  VersionEdit new_db;
  new_db.SetComparatorName(user_comparator()->Name());
  new_db.SetLogNumber(0);
  new_db.SetNextFile(2);
  new_db.SetLastSequence(0);

  const std::string manifest = DescriptorFileName(dbname_, 1);
  WritableFile* file;
  Status s = env_->NewWritableFile(manifest, &file);
  if (!s.ok()) {
    return s;
  }
  {
    log::Writer log(file);
    std::string record;
    new_db.EncodeTo(&record);
    s = log.AddRecord(record);
    if (s.ok()) {
      s = file->Close();
    }
  }
  delete file;
  if (s.ok()) {
    // Make "CURRENT" file that points to the new manifest file.
    s = SetCurrentFile(env_, dbname_, 1);
  } else {
    env_->DeleteFile(manifest);
  }
  return s;
}